

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_dns_name.c
# Opt level: O0

ares_status_t
ares_fetch_dnsname_into_buf(ares_buf_t *buf,ares_buf_t *dest,size_t len,ares_bool_t is_hostname)

{
  ares_status_t aVar1;
  ares_bool_t aVar2;
  uchar *puVar3;
  uchar local_55;
  char local_54;
  char local_53;
  char local_52;
  byte local_51;
  uchar escape [4];
  uchar *puStack_50;
  uchar c;
  size_t i;
  ares_status_t status;
  uchar *ptr;
  size_t remaining_len;
  uchar *puStack_28;
  ares_bool_t is_hostname_local;
  size_t len_local;
  ares_buf_t *dest_local;
  ares_buf_t *buf_local;
  
  remaining_len._4_4_ = is_hostname;
  puStack_28 = (uchar *)len;
  len_local = (size_t)dest;
  dest_local = buf;
  puVar3 = ares_buf_peek(buf,(size_t *)&ptr);
  if (((dest_local == (ares_buf_t *)0x0) || (puStack_28 == (uchar *)0x0)) || (ptr < puStack_28)) {
    buf_local._4_4_ = ARES_EBADRESP;
  }
  else {
    for (puStack_50 = (uchar *)0x0; puStack_50 < puStack_28; puStack_50 = puStack_50 + 1) {
      local_51 = puVar3[(long)puStack_50];
      if ((((remaining_len._4_4_ != ARES_FALSE) && ((local_51 < 0x61 || (0x7a < local_51)))) &&
          ((local_51 < 0x41 || (0x5a < local_51)))) &&
         (((local_51 < 0x30 || (0x39 < local_51)) &&
          ((local_51 != 0x2d &&
           ((((local_51 != 0x2e && (local_51 != 0x5f)) && (local_51 != 0x2f)) && (local_51 != 0x2a))
           )))))) {
        return ARES_EBADRESP;
      }
      if (len_local != 0) {
        if ((local_51 < 0x20) || (0x7e < local_51)) {
          local_55 = '\\';
          local_54 = local_51 / 100 + 0x30;
          local_53 = (char)(((ulong)local_51 % 100) / 10) + '0';
          local_52 = local_51 % 10 + 0x30;
          aVar1 = ares_buf_append((ares_buf_t *)len_local,&local_55,4);
          if (aVar1 != ARES_SUCCESS) {
            return aVar1;
          }
        }
        else {
          aVar2 = is_reservedch((uint)local_51);
          if ((aVar2 != ARES_FALSE) &&
             (aVar1 = ares_buf_append_byte((ares_buf_t *)len_local,'\\'), aVar1 != ARES_SUCCESS)) {
            return aVar1;
          }
          aVar1 = ares_buf_append_byte((ares_buf_t *)len_local,local_51);
          if (aVar1 != ARES_SUCCESS) {
            return aVar1;
          }
        }
      }
    }
    buf_local._4_4_ = ares_buf_consume(dest_local,(size_t)puStack_28);
  }
  return buf_local._4_4_;
}

Assistant:

static ares_status_t ares_fetch_dnsname_into_buf(ares_buf_t *buf,
                                                 ares_buf_t *dest, size_t len,
                                                 ares_bool_t is_hostname)
{
  size_t               remaining_len;
  const unsigned char *ptr = ares_buf_peek(buf, &remaining_len);
  ares_status_t        status;
  size_t               i;

  if (buf == NULL || len == 0 || remaining_len < len) {
    return ARES_EBADRESP;
  }

  for (i = 0; i < len; i++) {
    unsigned char c = ptr[i];

    /* Hostnames have a very specific allowed character set.  Anything outside
     * of that (non-printable and reserved included) are disallowed */
    if (is_hostname && !ares_is_hostnamech(c)) {
      status = ARES_EBADRESP;
      goto fail;
    }

    /* NOTE: dest may be NULL if the user is trying to skip the name. validation
     *       still occurs above. */
    if (dest == NULL) {
      continue;
    }

    /* Non-printable characters need to be output as \DDD */
    if (!ares_isprint(c)) {
      unsigned char escape[4];

      escape[0] = '\\';
      escape[1] = '0' + (c / 100);
      escape[2] = '0' + ((c % 100) / 10);
      escape[3] = '0' + (c % 10);

      status = ares_buf_append(dest, escape, sizeof(escape));
      if (status != ARES_SUCCESS) {
        goto fail; /* LCOV_EXCL_LINE: OutOfMemory */
      }

      continue;
    }

    /* Reserved characters need to be escaped, otherwise normal */
    if (is_reservedch(c)) {
      status = ares_buf_append_byte(dest, '\\');
      if (status != ARES_SUCCESS) {
        goto fail; /* LCOV_EXCL_LINE: OutOfMemory */
      }
    }

    status = ares_buf_append_byte(dest, c);
    if (status != ARES_SUCCESS) {
      return status; /* LCOV_EXCL_LINE: OutOfMemory */
    }
  }

  return ares_buf_consume(buf, len);

fail:
  return status;
}